

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O3

void wabt::WriteFloatHex(char *buffer,size_t size,uint32_t bits)

{
  undefined4 *puVar1;
  byte *pbVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  size_t __n;
  bool bVar9;
  char buffer_1 [20];
  undefined1 local_28 [24];
  
  puVar1 = (undefined4 *)local_28;
  uVar8 = bits >> 0x17 & 0xff;
  uVar4 = uVar8 - 0x7f;
  if ((int)bits < 0) {
    puVar1 = (undefined4 *)(local_28 + 1);
    local_28[0] = 0x2d;
  }
  uVar5 = bits & 0x7fffff;
  if (uVar4 == 0x80) {
    pbVar2 = (byte *)((long)puVar1 + 3);
    if (uVar5 == 0) {
      *puVar1 = 0x666e69;
    }
    else {
      *puVar1 = 0x6e616e;
      if (uVar5 != 0x400000) {
        pbVar2[0] = 0x3a;
        pbVar2[1] = 0x30;
        pbVar2[2] = 0x78;
        pbVar2[3] = 0;
        iVar7 = -8;
        do {
          uVar4 = uVar5 << 4;
          iVar7 = iVar7 + 1;
          bVar9 = uVar5 < 0x1000000;
          uVar5 = uVar4;
        } while (bVar9);
        pbVar2 = (byte *)((long)puVar1 + 6);
        for (; iVar7 != 0; iVar7 = iVar7 + 1) {
          *pbVar2 = "0123456789abcdef"[uVar4 >> 0x1c];
          pbVar2 = pbVar2 + 1;
          uVar4 = uVar4 << 4;
        }
      }
    }
    goto LAB_00175c11;
  }
  *(undefined2 *)puVar1 = 0x7830;
  *(byte *)((long)puVar1 + 2) = (uVar8 == 0 && uVar5 == 0) ^ 0x31;
  if (uVar5 == 0) {
    pcVar3 = (char *)((long)puVar1 + 3);
  }
  else {
    uVar6 = uVar5 << 9;
    if (uVar8 == 0) {
      uVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar6 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
      uVar6 = uVar6 << ((char)uVar4 + 1U & 0x1f);
      if (uVar4 == 0x1f) {
        *(undefined1 *)((long)puVar1 + 3) = 0x2e;
        pcVar3 = (char *)(puVar1 + 1);
        uVar4 = 0xffffff62;
        goto LAB_00175b57;
      }
      uVar4 = -uVar4 - 0x7f;
    }
    *(undefined1 *)((long)puVar1 + 3) = 0x2e;
    pcVar3 = (char *)(puVar1 + 1);
    for (; uVar6 != 0; uVar6 = uVar6 << 4) {
      *pcVar3 = "0123456789abcdef"[uVar6 >> 0x1c];
      pcVar3 = pcVar3 + 1;
    }
  }
LAB_00175b57:
  *pcVar3 = 'p';
  if (uVar8 == 0 && uVar5 == 0) {
    pcVar3[3] = '\0';
    pcVar3[1] = '+';
    pcVar3[2] = '0';
    pbVar2 = (byte *)(pcVar3 + 3);
    goto LAB_00175c11;
  }
  uVar8 = -uVar4;
  if (0 < (int)uVar4) {
    uVar8 = uVar4;
  }
  pcVar3[1] = (char)((int)uVar4 >> 0x1f) * -2 + '+';
  if (uVar8 < 100) {
    pbVar2 = (byte *)(pcVar3 + 2);
    if (9 < uVar8) goto LAB_00175bc6;
  }
  else {
    pcVar3[2] = (char)(uVar8 / 100) + (char)(((ulong)uVar8 / 100) * 0x1999999a >> 0x20) * -10 | 0x30
    ;
    pbVar2 = (byte *)(pcVar3 + 3);
LAB_00175bc6:
    *pbVar2 = (char)(uVar8 / 10) + (char)(((ulong)uVar8 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
    pbVar2 = pbVar2 + 1;
  }
  *pbVar2 = (char)uVar8 + (char)(uVar8 / 10) * -10 | 0x30;
  pbVar2 = pbVar2 + 1;
LAB_00175c11:
  __n = size - 1;
  if ((ulong)((long)pbVar2 - (long)local_28) < size) {
    __n = (long)pbVar2 - (long)local_28;
  }
  memcpy(buffer,local_28,__n);
  buffer[__n] = '\0';
  return;
}

Assistant:

void WriteFloatHex(char* buffer, size_t size, uint32_t bits) {
  return FloatWriter<float>::WriteHex(buffer, size, bits);
}